

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeSet * __thiscall icu_63::UnicodeSet::add(UnicodeSet *this,UChar32 start,UChar32 end)

{
  uint uVar1;
  uint uVar2;
  UChar32 range [3];
  
  range[0] = 0x10ffff;
  if ((uint)start < 0x10ffff) {
    range[0] = start;
  }
  if (start < 0) {
    range[0] = 0;
  }
  uVar1 = 0x10ffff;
  if ((uint)end < 0x10ffff) {
    uVar1 = end;
  }
  if ((uint)range[0] < uVar1 && -1 < end) {
    range[1] = uVar1 + 1;
    range[2] = 0x110000;
    add(this,range,2,'\0');
  }
  else {
    uVar2 = 0;
    if (-1 < end) {
      uVar2 = uVar1;
    }
    if (range[0] == uVar2) {
      add(this,range[0]);
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::add(UChar32 start, UChar32 end) {
    if (pinCodePoint(start) < pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        add(range, 2, 0);
    } else if (start == end) {
        add(start);
    }
    return *this;
}